

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::way_point,std::allocator<xray_re::way_point>>,xray_re::way_point_io>
          (xr_writer *this,undefined8 *container)

{
  way_point *pwVar1;
  xr_writer *this_00;
  way_point *point;
  
  pwVar1 = (way_point *)container[1];
  this_00 = this;
  for (point = (way_point *)*container; point != pwVar1; point = point + 1) {
    way_point_io::operator()((way_point_io *)this_00,point,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}